

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O1

Vec_Ptr_t * Llb_Nonlin4DerivePartitions(DdManager *dd,Aig_Man_t *pAig,Vec_Int_t *vOrder)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  uint uVar4;
  DdNode *pDVar5;
  Vec_Ptr_t *__ptr;
  void **ppvVar6;
  DdNode *n;
  Vec_Ptr_t *pVVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  
  Aig_ManCleanData(pAig);
  pDVar5 = Cudd_ReadOne(dd);
  (pAig->pConst1->field_5).pData = pDVar5;
  pVVar7 = pAig->vCis;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      pvVar2 = pVVar7->pArray[lVar9];
      iVar8 = *(int *)((long)pvVar2 + 0x24);
      if (((long)iVar8 < 0) || (vOrder->nSize <= iVar8)) goto LAB_007deb21;
      pDVar5 = Cudd_bddIthVar(dd,vOrder->pArray[iVar8]);
      *(DdNode **)((long)pvVar2 + 0x28) = pDVar5;
      lVar9 = lVar9 + 1;
      pVVar7 = pAig->vCis;
    } while (lVar9 < pVVar7->nSize);
  }
  pVVar7 = pAig->vObjs;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      pvVar2 = pVVar7->pArray[lVar9];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
        iVar8 = *(int *)((long)pvVar2 + 0x24);
        if (((long)iVar8 < 0) || (vOrder->nSize <= iVar8)) goto LAB_007deb21;
        if (-1 < vOrder->pArray[iVar8]) {
          pDVar5 = Cudd_bddIthVar(dd,vOrder->pArray[iVar8]);
          *(DdNode **)((long)pvVar2 + 0x28) = pDVar5;
          Cudd_Ref(pDVar5);
        }
      }
      lVar9 = lVar9 + 1;
      pVVar7 = pAig->vObjs;
    } while (lVar9 < pVVar7->nSize);
  }
  if (0 < pAig->nRegs) {
    iVar8 = 0;
    do {
      uVar4 = pAig->nTruePos + iVar8;
      if (((int)uVar4 < 0) || (pAig->vCos->nSize <= (int)uVar4)) goto LAB_007deb40;
      pvVar2 = pAig->vCos->pArray[uVar4];
      iVar10 = *(int *)((long)pvVar2 + 0x24);
      if (((long)iVar10 < 0) || (vOrder->nSize <= iVar10)) {
LAB_007deb21:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pDVar5 = Cudd_bddIthVar(dd,vOrder->pArray[iVar10]);
      *(DdNode **)((long)pvVar2 + 0x28) = pDVar5;
      iVar8 = iVar8 + 1;
    } while (iVar8 < pAig->nRegs);
  }
  __ptr = (Vec_Ptr_t *)malloc(0x10);
  __ptr->nCap = 100;
  __ptr->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  __ptr->pArray = ppvVar6;
  pVVar7 = pAig->vObjs;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      pvVar2 = pVVar7->pArray[lVar9];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
        pDVar5 = Cudd_bddAnd(dd,(DdNode *)
                                ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^
                                *(ulong *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) +
                                          0x28)),
                             (DdNode *)
                             ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^
                             *(ulong *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) +
                                       0x28)));
        if (pDVar5 == (DdNode *)0x0) goto LAB_007dea72;
        Cudd_Ref(pDVar5);
        if (*(DdNode **)((long)pvVar2 + 0x28) == (DdNode *)0x0) {
          *(DdNode **)((long)pvVar2 + 0x28) = pDVar5;
        }
        else {
          n = Cudd_bddXnor(dd,*(DdNode **)((long)pvVar2 + 0x28),pDVar5);
          if (n == (DdNode *)0x0) goto LAB_007dea72;
          Cudd_Ref(n);
          Cudd_RecursiveDeref(dd,pDVar5);
          uVar4 = __ptr->nSize;
          uVar1 = __ptr->nCap;
          if (uVar4 == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (__ptr->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(__ptr->pArray,0x80);
              }
              iVar8 = 0x10;
            }
            else {
              iVar8 = uVar1 * 2;
              if (iVar8 <= (int)uVar1) goto LAB_007de901;
              if (__ptr->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(__ptr->pArray,(ulong)uVar1 << 4);
              }
            }
            __ptr->pArray = ppvVar6;
            __ptr->nCap = iVar8;
          }
LAB_007de901:
          __ptr->nSize = uVar4 + 1;
          __ptr->pArray[(int)uVar4] = n;
        }
      }
      lVar9 = lVar9 + 1;
      pVVar7 = pAig->vObjs;
    } while (lVar9 < pVVar7->nSize);
  }
  if (0 < pAig->nRegs) {
    iVar8 = 0;
    do {
      uVar4 = pAig->nTruePos + iVar8;
      if (((int)uVar4 < 0) || (pAig->vCos->nSize <= (int)uVar4)) {
LAB_007deb40:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = pAig->vCos->pArray[uVar4];
      uVar3 = *(ulong *)((long)pvVar2 + 8);
      pDVar5 = Cudd_bddXnor(dd,*(DdNode **)((long)pvVar2 + 0x28),
                            (DdNode *)
                            ((ulong)((uint)uVar3 & 1) ^
                            *(ulong *)((uVar3 & 0xfffffffffffffffe) + 0x28)));
      if (pDVar5 == (DdNode *)0x0) {
LAB_007dea72:
        pVVar7 = pAig->vObjs;
        if (0 < pVVar7->nSize) {
          lVar9 = 0;
          do {
            pvVar2 = pVVar7->pArray[lVar9];
            if (((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7))
               && (*(DdNode **)((long)pvVar2 + 0x28) != (DdNode *)0x0)) {
              Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar2 + 0x28));
            }
            lVar9 = lVar9 + 1;
            pVVar7 = pAig->vObjs;
          } while (lVar9 < pVVar7->nSize);
        }
        iVar8 = __ptr->nSize;
        if (0 < (long)iVar8) {
          ppvVar6 = __ptr->pArray;
          lVar9 = 0;
          do {
            Cudd_RecursiveDeref(dd,(DdNode *)ppvVar6[lVar9]);
            lVar9 = lVar9 + 1;
          } while (iVar8 != lVar9);
        }
        if (__ptr->pArray != (void **)0x0) {
          free(__ptr->pArray);
          __ptr->pArray = (void **)0x0;
        }
        free(__ptr);
        return (Vec_Ptr_t *)0x0;
      }
      Cudd_Ref(pDVar5);
      uVar4 = __ptr->nSize;
      uVar1 = __ptr->nCap;
      if (uVar4 == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (__ptr->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(__ptr->pArray,0x80);
          }
          iVar10 = 0x10;
        }
        else {
          iVar10 = uVar1 * 2;
          if (iVar10 <= (int)uVar1) goto LAB_007de9fa;
          if (__ptr->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(__ptr->pArray,(ulong)uVar1 << 4);
          }
        }
        __ptr->pArray = ppvVar6;
        __ptr->nCap = iVar10;
      }
LAB_007de9fa:
      __ptr->nSize = uVar4 + 1;
      __ptr->pArray[(int)uVar4] = pDVar5;
      iVar8 = iVar8 + 1;
    } while (iVar8 < pAig->nRegs);
  }
  pVVar7 = pAig->vObjs;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      pvVar2 = pVVar7->pArray[lVar9];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
        Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar2 + 0x28));
      }
      lVar9 = lVar9 + 1;
      pVVar7 = pAig->vObjs;
    } while (lVar9 < pVVar7->nSize);
  }
  return __ptr;
}

Assistant:

Vec_Ptr_t * Llb_Nonlin4DerivePartitions( DdManager * dd, Aig_Man_t * pAig, Vec_Int_t * vOrder )
{
    Vec_Ptr_t * vRoots;
    Aig_Obj_t * pObj;
    DdNode * bBdd, * bBdd0, * bBdd1, * bPart;
    int i;
    Aig_ManCleanData( pAig );
    // assign elementary variables
    Aig_ManConst1(pAig)->pData = Cudd_ReadOne(dd); 
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
    Aig_ManForEachNode( pAig, pObj, i )
        if ( Llb_ObjBddVar(vOrder, pObj) >= 0 )
        {
            pObj->pData = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
            Cudd_Ref( (DdNode *)pObj->pData );
        }
    Saig_ManForEachLi( pAig, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
    // compute intermediate BDDs
    vRoots = Vec_PtrAlloc( 100 );
    Aig_ManForEachNode( pAig, pObj, i )
    {
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
        bBdd  = Cudd_bddAnd( dd, bBdd0, bBdd1 );
        if ( bBdd == NULL )
            goto finish;
        Cudd_Ref( bBdd );
        if ( pObj->pData == NULL )
        {
            pObj->pData = bBdd;
            continue;
        }
        // create new partition
        bPart = Cudd_bddXnor( dd, (DdNode *)pObj->pData, bBdd );  
        if ( bPart == NULL )
            goto finish;
        Cudd_Ref( bPart );
        Cudd_RecursiveDeref( dd, bBdd );
        Vec_PtrPush( vRoots, bPart );
//printf( "%d ", Cudd_DagSize(bPart) );
    }
    // compute register output BDDs
    Saig_ManForEachLi( pAig, pObj, i )
    {
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bPart = Cudd_bddXnor( dd, (DdNode *)pObj->pData, bBdd0 );  
        if ( bPart == NULL )
            goto finish;
        Cudd_Ref( bPart );
        Vec_PtrPush( vRoots, bPart );
//printf( "%d ", Cudd_DagSize(bPart) );
    }
//printf( "\n" );
    Aig_ManForEachNode( pAig, pObj, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    return vRoots;
    // early termination
finish:
    Aig_ManForEachNode( pAig, pObj, i )
        if ( pObj->pData )
            Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    Vec_PtrForEachEntry( DdNode *, vRoots, bPart, i )
        Cudd_RecursiveDeref( dd, bPart );
    Vec_PtrFree( vRoots );
    return NULL;
}